

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

bool __thiscall
cmLocalUnixMakefileGenerator3::ScanDependencies
          (cmLocalUnixMakefileGenerator3 *this,string *targetDir,string *dependFile,
          string *internalDependFile,DependencyMap *validDeps)

{
  cmMakefile *this_00;
  _Alloc_hider this_01;
  bool bVar1;
  Encoding EVar2;
  string *psVar3;
  undefined7 extraout_var;
  cmValue cVar4;
  ostream *poVar5;
  undefined1 uVar6;
  cmValue unaff_RBP;
  ulong uVar7;
  pointer __lhs;
  string_view arg;
  undefined1 local_558 [16];
  string dirInfoFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  langs;
  cmGeneratedFileStream ruleFileStream;
  cmGeneratedFileStream internalRuleFileStream;
  
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  local_558._8_8_ = dependFile;
  psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  ruleFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       (psVar3->_M_dataplus)._M_p;
  ruleFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
  _vptr_basic_ostream = (_func_int **)psVar3->_M_string_length;
  internalRuleFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
  _vptr_basic_ostream = (_func_int **)0x2b;
  internalRuleFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>._8_8_ =
       anon_var_dwarf_16bda8c;
  cmStrCat<>(&dirInfoFile,(cmAlphaNum *)&ruleFileStream,(cmAlphaNum *)&internalRuleFileStream);
  bVar1 = cmMakefile::ReadListFile(this_00,&dirInfoFile);
  if (bVar1) {
    bVar1 = cmSystemTools::GetErrorOccurredFlag();
    unaff_RBP.Value = (string *)(CONCAT71(extraout_var,bVar1) & 0xffffffff);
    std::__cxx11::string::~string((string *)&dirInfoFile);
    if ((char)unaff_RBP.Value == '\0') {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ruleFileStream,"CMAKE_FORCE_UNIX_PATHS",
                 (allocator<char> *)&internalRuleFileStream);
      cVar4 = cmMakefile::GetDefinition(this_00,(string *)&ruleFileStream);
      std::__cxx11::string::~string((string *)&ruleFileStream);
      if (cVar4.Value != (string *)0x0) {
        bVar1 = cmIsOff((cmValue)0x416ee4);
        if (!bVar1) {
          cmSystemTools::s_ForceUnixPaths = true;
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ruleFileStream,"CMAKE_RELATIVE_PATH_TOP_SOURCE",
                 (allocator<char> *)&internalRuleFileStream);
      cVar4 = cmMakefile::GetDefinition(this_00,(string *)&ruleFileStream);
      std::__cxx11::string::~string((string *)&ruleFileStream);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ruleFileStream,"CMAKE_RELATIVE_PATH_TOP_BINARY",
                 (allocator<char> *)&internalRuleFileStream);
      unaff_RBP = cmMakefile::GetDefinition(this_00,(string *)&ruleFileStream);
      std::__cxx11::string::~string((string *)&ruleFileStream);
      if (unaff_RBP.Value != (string *)0x0 && cVar4.Value != (string *)0x0) {
        cmOutputConverter::SetRelativePathTop
                  (&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,cVar4.Value,unaff_RBP.Value);
      }
      goto LAB_00416fb3;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&dirInfoFile);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ruleFileStream,"Directory Information file not found",
             (allocator<char> *)&internalRuleFileStream);
  cmSystemTools::Error((string *)&ruleFileStream);
  std::__cxx11::string::~string((string *)&ruleFileStream);
LAB_00416fb3:
  EVar2 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[5])();
  cmGeneratedFileStream::cmGeneratedFileStream
            (&ruleFileStream,(string *)local_558._8_8_,false,EVar2);
  cmGeneratedFileStream::SetCopyIfDifferent(&ruleFileStream,true);
  if (((&ruleFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20
       )[(long)ruleFileStream.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
               _vptr_basic_ostream[-3]] & 5) == 0) {
    EVar2 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
              _vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream
              (&internalRuleFileStream,internalDependFile,false,EVar2);
    bVar1 = ((&internalRuleFileStream.super_ofstream.
               super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
             [(long)internalRuleFileStream.super_ofstream.
                    super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] & 5)
            == 0;
    uVar7 = CONCAT71((int7)((ulong)unaff_RBP.Value >> 8),bVar1);
    if (bVar1) {
      WriteDisclaimer(this,(ostream *)&ruleFileStream);
      WriteDisclaimer(this,(ostream *)&internalRuleFileStream);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dirInfoFile,"CMAKE_DEPENDS_LANGUAGES",(allocator<char> *)local_558);
      local_558._8_4_ = (int)uVar7;
      psVar3 = cmMakefile::GetSafeDefinition(this_00,&dirInfoFile);
      arg._M_str = (psVar3->_M_dataplus)._M_p;
      arg._M_len = psVar3->_M_string_length;
      cmExpandedList_abi_cxx11_(&langs,arg,false);
      std::__cxx11::string::~string((string *)&dirInfoFile);
      for (__lhs = langs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          __lhs != langs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
        bVar1 = std::operator==(__lhs,"C");
        if (bVar1) {
LAB_00417162:
          local_558._0_8_ = this;
          std::
          make_unique<cmDependsC,cmLocalUnixMakefileGenerator3*,std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>*>
                    ((cmLocalUnixMakefileGenerator3 **)&dirInfoFile,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_558,
                     targetDir,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      **)__lhs);
LAB_00417183:
          this_01._M_p = dirInfoFile._M_dataplus._M_p;
          if (dirInfoFile._M_dataplus._M_p != (pointer)0x0) {
            *(cmLocalUnixMakefileGenerator3 **)(dirInfoFile._M_dataplus._M_p + 8) = this;
            *(cmFileTimeCache **)(dirInfoFile._M_dataplus._M_p + 0x18) =
                 (((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
                  CMakeInstance->FileTimeCache)._M_t.
                 super___uniq_ptr_impl<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>._M_t.
                 super__Tuple_impl<0UL,_cmFileTimeCache_*,_std::default_delete<cmFileTimeCache>_>.
                 super__Head_base<0UL,_cmFileTimeCache_*,_false>._M_head_impl;
            std::__cxx11::string::_M_assign((string *)(dirInfoFile._M_dataplus._M_p + 0x20));
            std::__cxx11::string::_M_assign((string *)(this_01._M_p + 0x40));
            cmDepends::Write((cmDepends *)this_01._M_p,(ostream *)&ruleFileStream,
                             (ostream *)&internalRuleFileStream);
            (**(code **)(*(long *)this_01._M_p + 8))(this_01._M_p);
          }
        }
        else {
          bVar1 = std::operator==(__lhs,"CXX");
          if (bVar1) goto LAB_00417162;
          bVar1 = std::operator==(__lhs,"RC");
          if (bVar1) goto LAB_00417162;
          bVar1 = std::operator==(__lhs,"ASM");
          if (bVar1) goto LAB_00417162;
          bVar1 = std::operator==(__lhs,"OBJC");
          if (bVar1) goto LAB_00417162;
          bVar1 = std::operator==(__lhs,"OBJCXX");
          if (bVar1) goto LAB_00417162;
          bVar1 = std::operator==(__lhs,"CUDA");
          if (bVar1) goto LAB_00417162;
          bVar1 = std::operator==(__lhs,"HIP");
          if (bVar1) goto LAB_00417162;
          bVar1 = std::operator==(__lhs,"ISPC");
          if (bVar1) goto LAB_00417162;
          bVar1 = std::operator==(__lhs,"Fortran");
          if (bVar1) {
            poVar5 = std::operator<<((ostream *)&ruleFileStream,
                                     "# Note that incremental build could trigger ");
            std::operator<<(poVar5,"a call to cmake_copy_f90_mod on each re-build\n");
            local_558._0_8_ = this;
            std::make_unique<cmDependsFortran,cmLocalUnixMakefileGenerator3*>
                      ((cmLocalUnixMakefileGenerator3 **)&dirInfoFile);
            goto LAB_00417183;
          }
          bVar1 = std::operator==(__lhs,"Java");
          if (bVar1) {
            std::make_unique<cmDependsJava>();
            goto LAB_00417183;
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&langs);
      uVar7 = local_558._8_8_ & 0xffffffff;
    }
    uVar6 = (undefined1)uVar7;
    cmGeneratedFileStream::~cmGeneratedFileStream(&internalRuleFileStream);
  }
  else {
    uVar6 = 0;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&ruleFileStream);
  return (bool)uVar6;
}

Assistant:

bool cmLocalUnixMakefileGenerator3::ScanDependencies(
  std::string const& targetDir, std::string const& dependFile,
  std::string const& internalDependFile, cmDepends::DependencyMap& validDeps)
{
  // Read the directory information file.
  cmMakefile* mf = this->Makefile;
  bool haveDirectoryInfo = false;
  {
    std::string dirInfoFile =
      cmStrCat(this->GetCurrentBinaryDirectory(),
               "/CMakeFiles/CMakeDirectoryInformation.cmake");
    if (mf->ReadListFile(dirInfoFile) &&
        !cmSystemTools::GetErrorOccurredFlag()) {
      haveDirectoryInfo = true;
    }
  }

  // Lookup useful directory information.
  if (haveDirectoryInfo) {
    // Test whether we need to force Unix paths.
    if (cmValue force = mf->GetDefinition("CMAKE_FORCE_UNIX_PATHS")) {
      if (!cmIsOff(force)) {
        cmSystemTools::SetForceUnixPaths(true);
      }
    }

    // Setup relative path top directories.
    cmValue relativePathTopSource =
      mf->GetDefinition("CMAKE_RELATIVE_PATH_TOP_SOURCE");
    cmValue relativePathTopBinary =
      mf->GetDefinition("CMAKE_RELATIVE_PATH_TOP_BINARY");
    if (relativePathTopSource && relativePathTopBinary) {
      this->SetRelativePathTop(*relativePathTopSource, *relativePathTopBinary);
    }
  } else {
    cmSystemTools::Error("Directory Information file not found");
  }

  // Open the make depends file.  This should be copy-if-different
  // because the make tool may try to reload it needlessly otherwise.
  cmGeneratedFileStream ruleFileStream(
    dependFile, false, this->GlobalGenerator->GetMakefileEncoding());
  ruleFileStream.SetCopyIfDifferent(true);
  if (!ruleFileStream) {
    return false;
  }

  // Open the cmake dependency tracking file.  This should not be
  // copy-if-different because dependencies are re-scanned when it is
  // older than the DependInfo.cmake.
  cmGeneratedFileStream internalRuleFileStream(
    internalDependFile, false, this->GlobalGenerator->GetMakefileEncoding());
  if (!internalRuleFileStream) {
    return false;
  }

  this->WriteDisclaimer(ruleFileStream);
  this->WriteDisclaimer(internalRuleFileStream);

  // for each language we need to scan, scan it
  std::vector<std::string> langs =
    cmExpandedList(mf->GetSafeDefinition("CMAKE_DEPENDS_LANGUAGES"));
  for (std::string const& lang : langs) {
    // construct the checker
    // Create the scanner for this language
    std::unique_ptr<cmDepends> scanner;
    if (lang == "C" || lang == "CXX" || lang == "RC" || lang == "ASM" ||
        lang == "OBJC" || lang == "OBJCXX" || lang == "CUDA" ||
        lang == "HIP" || lang == "ISPC") {
      // TODO: Handle RC (resource files) dependencies correctly.
      scanner = cm::make_unique<cmDependsC>(this, targetDir, lang, &validDeps);
    }
#ifndef CMAKE_BOOTSTRAP
    else if (lang == "Fortran") {
      ruleFileStream << "# Note that incremental build could trigger "
                     << "a call to cmake_copy_f90_mod on each re-build\n";
      scanner = cm::make_unique<cmDependsFortran>(this);
    } else if (lang == "Java") {
      scanner = cm::make_unique<cmDependsJava>();
    }
#endif

    if (scanner) {
      scanner->SetLocalGenerator(this);
      scanner->SetFileTimeCache(
        this->GlobalGenerator->GetCMakeInstance()->GetFileTimeCache());
      scanner->SetLanguage(lang);
      scanner->SetTargetDirectory(targetDir);
      scanner->Write(ruleFileStream, internalRuleFileStream);
    }
  }

  return true;
}